

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<double>::
GetDescriberImpl<testing::internal::MatcherBase<double>::ValuePolicy<testing::MatcherInterface<double>const*,true>>
          (MatcherBase<double> *m)

{
  __tuple_element_t<1UL,_tuple<const_MatcherBase<double>_*,_const_MatcherInterface<double>_*>_>
  *ppMVar1;
  MatcherBase<double> *local_28;
  tuple<const_testing::internal::MatcherBase<double>_*,_const_testing::MatcherInterface<double>_*>
  local_20;
  MatcherBase<double> *local_10;
  MatcherBase<double> *m_local;
  
  local_28 = m;
  local_10 = m;
  ValuePolicy<const_testing::MatcherInterface<double>_*,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<double>const*,testing::MatcherInterface<double>const*>
            ((MatcherBase<double> **)&local_20,(MatcherInterface<double> **)&local_28);
  ppMVar1 = std::
            get<1ul,testing::internal::MatcherBase<double>const*,testing::MatcherInterface<double>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }